

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_switch::dump(statement_switch *this,ostream *o)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  statement_block *psVar4;
  _Elt_pointer ppsVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [11];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  char *pcVar23;
  uint uVar24;
  _Elt_pointer ppsVar25;
  _Map_pointer pppsVar26;
  statement_base **ptr;
  _Elt_pointer ppsVar27;
  statement_base **ptr_1;
  slot_type *this_00;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginSwitch: Condition = ",0x1b);
  compiler_type::dump_expr((this->mTree).mRoot,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n",3);
  pcVar2 = (this->mCases).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
           .ctrl_;
  this_00 = (this->mCases).
            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
            .
            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
            .slots_;
  cVar1 = *pcVar2;
  pcVar23 = pcVar2;
  while (cVar1 < -1) {
    iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar23 < (char)iVar11);
    in_XMM1_Bb = -(pcVar23[1] < (char)((uint)iVar11 >> 8));
    in_XMM1_Bc = -(pcVar23[2] < (char)((uint)iVar11 >> 0x10));
    in_XMM1_Bd = -(pcVar23[3] < (char)((uint)iVar11 >> 0x18));
    in_XMM1_Be = -(pcVar23[4] < (char)iVar12);
    in_XMM1_Bf = -(pcVar23[5] < (char)((uint)iVar12 >> 8));
    in_XMM1_Bg = -(pcVar23[6] < (char)((uint)iVar12 >> 0x10));
    in_XMM1_Bh = -(pcVar23[7] < (char)((uint)iVar12 >> 0x18));
    in_XMM1_Bi = -(pcVar23[8] < (char)iVar13);
    in_XMM1_Bj = -(pcVar23[9] < (char)((uint)iVar13 >> 8));
    in_XMM1_Bk = -(pcVar23[10] < (char)((uint)iVar13 >> 0x10));
    in_XMM1_Bl = -(pcVar23[0xb] < (char)((uint)iVar13 >> 0x18));
    in_XMM1_Bm = -(pcVar23[0xc] < (char)iVar14);
    in_XMM1_Bn = -(pcVar23[0xd] < (char)((uint)iVar14 >> 8));
    in_XMM1_Bo = -(pcVar23[0xe] < (char)((uint)iVar14 >> 0x10));
    in_XMM1_Bp = -(pcVar23[0xf] < (char)((uint)iVar14 >> 0x18));
    auVar7[1] = in_XMM1_Bb;
    auVar7[0] = in_XMM1_Ba;
    auVar7[2] = in_XMM1_Bc;
    auVar7[3] = in_XMM1_Bd;
    auVar7[4] = in_XMM1_Be;
    auVar7[5] = in_XMM1_Bf;
    auVar7[6] = in_XMM1_Bg;
    auVar7[7] = in_XMM1_Bh;
    auVar7[8] = in_XMM1_Bi;
    auVar7[9] = in_XMM1_Bj;
    auVar7[10] = in_XMM1_Bk;
    auVar7[0xb] = in_XMM1_Bl;
    auVar7[0xc] = in_XMM1_Bm;
    auVar7[0xd] = in_XMM1_Bn;
    auVar7[0xe] = in_XMM1_Bo;
    auVar7[0xf] = in_XMM1_Bp;
    auVar8[1] = in_XMM1_Bb;
    auVar8[0] = in_XMM1_Ba;
    auVar8[2] = in_XMM1_Bc;
    auVar8[3] = in_XMM1_Bd;
    auVar8[4] = in_XMM1_Be;
    auVar8[5] = in_XMM1_Bf;
    auVar8[6] = in_XMM1_Bg;
    auVar8[7] = in_XMM1_Bh;
    auVar8[8] = in_XMM1_Bi;
    auVar8[9] = in_XMM1_Bj;
    auVar8[10] = in_XMM1_Bk;
    auVar8[0xb] = in_XMM1_Bl;
    auVar8[0xc] = in_XMM1_Bm;
    auVar8[0xd] = in_XMM1_Bn;
    auVar8[0xe] = in_XMM1_Bo;
    auVar8[0xf] = in_XMM1_Bp;
    auVar21[1] = in_XMM1_Bd;
    auVar21[0] = in_XMM1_Bc;
    auVar21[2] = in_XMM1_Be;
    auVar21[3] = in_XMM1_Bf;
    auVar21[4] = in_XMM1_Bg;
    auVar21[5] = in_XMM1_Bh;
    auVar21[6] = in_XMM1_Bi;
    auVar21[7] = in_XMM1_Bj;
    auVar21[8] = in_XMM1_Bk;
    auVar21[9] = in_XMM1_Bl;
    auVar21[10] = in_XMM1_Bm;
    auVar21[0xb] = in_XMM1_Bn;
    auVar21[0xc] = in_XMM1_Bo;
    auVar21[0xd] = in_XMM1_Bp;
    auVar19[1] = in_XMM1_Be;
    auVar19[0] = in_XMM1_Bd;
    auVar19[2] = in_XMM1_Bf;
    auVar19[3] = in_XMM1_Bg;
    auVar19[4] = in_XMM1_Bh;
    auVar19[5] = in_XMM1_Bi;
    auVar19[6] = in_XMM1_Bj;
    auVar19[7] = in_XMM1_Bk;
    auVar19[8] = in_XMM1_Bl;
    auVar19[9] = in_XMM1_Bm;
    auVar19[10] = in_XMM1_Bn;
    auVar19[0xb] = in_XMM1_Bo;
    auVar19[0xc] = in_XMM1_Bp;
    auVar17[1] = in_XMM1_Bf;
    auVar17[0] = in_XMM1_Be;
    auVar17[2] = in_XMM1_Bg;
    auVar17[3] = in_XMM1_Bh;
    auVar17[4] = in_XMM1_Bi;
    auVar17[5] = in_XMM1_Bj;
    auVar17[6] = in_XMM1_Bk;
    auVar17[7] = in_XMM1_Bl;
    auVar17[8] = in_XMM1_Bm;
    auVar17[9] = in_XMM1_Bn;
    auVar17[10] = in_XMM1_Bo;
    auVar17[0xb] = in_XMM1_Bp;
    auVar15[1] = in_XMM1_Bg;
    auVar15[0] = in_XMM1_Bf;
    auVar15[2] = in_XMM1_Bh;
    auVar15[3] = in_XMM1_Bi;
    auVar15[4] = in_XMM1_Bj;
    auVar15[5] = in_XMM1_Bk;
    auVar15[6] = in_XMM1_Bl;
    auVar15[7] = in_XMM1_Bm;
    auVar15[8] = in_XMM1_Bn;
    auVar15[9] = in_XMM1_Bo;
    auVar15[10] = in_XMM1_Bp;
    uVar24 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar21 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar19 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar17 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar6 = 0;
    if (uVar24 != 0) {
      for (; (uVar24 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
      }
    }
    this_00 = (slot_type *)((long)this_00 + (ulong)(uVar6 << 4));
    cVar1 = pcVar23[uVar6];
    pcVar23 = pcVar23 + uVar6;
  }
  sVar3 = (this->mCases).
          super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          .
          super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          .capacity_;
  while (pcVar23 != pcVar2 + sVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginCase: Tag = \"",0x14);
    cs_impl::any::to_string_abi_cxx11_(&local_50,&this_00->key);
    std::__ostream_insert<char,std::char_traits<char>>
              (o,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"\" >\n",4);
    psVar4 = (this_00->value).second;
    ppsVar27 = (psVar4->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar5 = (psVar4->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar27 != ppsVar5) {
      ppsVar25 = (psVar4->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar26 = (psVar4->mBlock).
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        (*(*ppsVar27)->_vptr_statement_base[5])(*ppsVar27,o);
        ppsVar27 = ppsVar27 + 1;
        if (ppsVar27 == ppsVar25) {
          ppsVar27 = pppsVar26[1];
          pppsVar26 = pppsVar26 + 1;
          ppsVar25 = ppsVar27 + 0x40;
        }
      } while (ppsVar27 != ppsVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"< EndCase >\n",0xc);
    this_00 = this_00 + 1;
    cVar1 = pcVar23[1];
    pcVar23 = pcVar23 + 1;
    while (cVar1 < -1) {
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar23 < (char)iVar11);
      in_XMM1_Bb = -(pcVar23[1] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bc = -(pcVar23[2] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bd = -(pcVar23[3] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Be = -(pcVar23[4] < (char)iVar12);
      in_XMM1_Bf = -(pcVar23[5] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bg = -(pcVar23[6] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bh = -(pcVar23[7] < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Bi = -(pcVar23[8] < (char)iVar13);
      in_XMM1_Bj = -(pcVar23[9] < (char)((uint)iVar13 >> 8));
      in_XMM1_Bk = -(pcVar23[10] < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bl = -(pcVar23[0xb] < (char)((uint)iVar13 >> 0x18));
      in_XMM1_Bm = -(pcVar23[0xc] < (char)iVar14);
      in_XMM1_Bn = -(pcVar23[0xd] < (char)((uint)iVar14 >> 8));
      in_XMM1_Bo = -(pcVar23[0xe] < (char)((uint)iVar14 >> 0x10));
      in_XMM1_Bp = -(pcVar23[0xf] < (char)((uint)iVar14 >> 0x18));
      auVar9[1] = in_XMM1_Bb;
      auVar9[0] = in_XMM1_Ba;
      auVar9[2] = in_XMM1_Bc;
      auVar9[3] = in_XMM1_Bd;
      auVar9[4] = in_XMM1_Be;
      auVar9[5] = in_XMM1_Bf;
      auVar9[6] = in_XMM1_Bg;
      auVar9[7] = in_XMM1_Bh;
      auVar9[8] = in_XMM1_Bi;
      auVar9[9] = in_XMM1_Bj;
      auVar9[10] = in_XMM1_Bk;
      auVar9[0xb] = in_XMM1_Bl;
      auVar9[0xc] = in_XMM1_Bm;
      auVar9[0xd] = in_XMM1_Bn;
      auVar9[0xe] = in_XMM1_Bo;
      auVar9[0xf] = in_XMM1_Bp;
      auVar10[1] = in_XMM1_Bb;
      auVar10[0] = in_XMM1_Ba;
      auVar10[2] = in_XMM1_Bc;
      auVar10[3] = in_XMM1_Bd;
      auVar10[4] = in_XMM1_Be;
      auVar10[5] = in_XMM1_Bf;
      auVar10[6] = in_XMM1_Bg;
      auVar10[7] = in_XMM1_Bh;
      auVar10[8] = in_XMM1_Bi;
      auVar10[9] = in_XMM1_Bj;
      auVar10[10] = in_XMM1_Bk;
      auVar10[0xb] = in_XMM1_Bl;
      auVar10[0xc] = in_XMM1_Bm;
      auVar10[0xd] = in_XMM1_Bn;
      auVar10[0xe] = in_XMM1_Bo;
      auVar10[0xf] = in_XMM1_Bp;
      auVar22[1] = in_XMM1_Bd;
      auVar22[0] = in_XMM1_Bc;
      auVar22[2] = in_XMM1_Be;
      auVar22[3] = in_XMM1_Bf;
      auVar22[4] = in_XMM1_Bg;
      auVar22[5] = in_XMM1_Bh;
      auVar22[6] = in_XMM1_Bi;
      auVar22[7] = in_XMM1_Bj;
      auVar22[8] = in_XMM1_Bk;
      auVar22[9] = in_XMM1_Bl;
      auVar22[10] = in_XMM1_Bm;
      auVar22[0xb] = in_XMM1_Bn;
      auVar22[0xc] = in_XMM1_Bo;
      auVar22[0xd] = in_XMM1_Bp;
      auVar20[1] = in_XMM1_Be;
      auVar20[0] = in_XMM1_Bd;
      auVar20[2] = in_XMM1_Bf;
      auVar20[3] = in_XMM1_Bg;
      auVar20[4] = in_XMM1_Bh;
      auVar20[5] = in_XMM1_Bi;
      auVar20[6] = in_XMM1_Bj;
      auVar20[7] = in_XMM1_Bk;
      auVar20[8] = in_XMM1_Bl;
      auVar20[9] = in_XMM1_Bm;
      auVar20[10] = in_XMM1_Bn;
      auVar20[0xb] = in_XMM1_Bo;
      auVar20[0xc] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Bf;
      auVar18[0] = in_XMM1_Be;
      auVar18[2] = in_XMM1_Bg;
      auVar18[3] = in_XMM1_Bh;
      auVar18[4] = in_XMM1_Bi;
      auVar18[5] = in_XMM1_Bj;
      auVar18[6] = in_XMM1_Bk;
      auVar18[7] = in_XMM1_Bl;
      auVar18[8] = in_XMM1_Bm;
      auVar18[9] = in_XMM1_Bn;
      auVar18[10] = in_XMM1_Bo;
      auVar18[0xb] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Bg;
      auVar16[0] = in_XMM1_Bf;
      auVar16[2] = in_XMM1_Bh;
      auVar16[3] = in_XMM1_Bi;
      auVar16[4] = in_XMM1_Bj;
      auVar16[5] = in_XMM1_Bk;
      auVar16[6] = in_XMM1_Bl;
      auVar16[7] = in_XMM1_Bm;
      auVar16[8] = in_XMM1_Bn;
      auVar16[9] = in_XMM1_Bo;
      auVar16[10] = in_XMM1_Bp;
      uVar24 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar22 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar20 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar18 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar16 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar6 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      this_00 = (slot_type *)((long)this_00 + (ulong)(uVar6 << 4));
      cVar1 = pcVar23[uVar6];
      pcVar23 = pcVar23 + uVar6;
    }
  }
  if (this->mDefault != (statement_block *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginDefaultCase >\n",0x15);
    psVar4 = this->mDefault;
    ppsVar27 = (psVar4->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar5 = (psVar4->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar27 != ppsVar5) {
      ppsVar25 = (psVar4->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar26 = (psVar4->mBlock).
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        (*(*ppsVar27)->_vptr_statement_base[5])(*ppsVar27,o);
        ppsVar27 = ppsVar27 + 1;
        if (ppsVar27 == ppsVar25) {
          ppsVar27 = pppsVar26[1];
          pppsVar26 = pppsVar26 + 1;
          ppsVar25 = ppsVar27 + 0x40;
        }
      } while (ppsVar27 != ppsVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"< EndDefaultCase >\n",0x13);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndSwitch >\n",0xe);
  return;
}

Assistant:

void statement_switch::dump(std::ostream &o) const
	{
		o << "< BeginSwitch: Condition = ";
		compiler_type::dump_expr(mTree.root(), o);
		o << " >\n";
		for (auto &it: mCases) {
			o << "< BeginCase: Tag = \"";
			o << it.first.to_string();
			o << "\" >\n";
			for (auto &ptr: it.second->get_block())
				ptr->dump(o);
			o << "< EndCase >\n";
		}
		if (mDefault != nullptr) {
			o << "< BeginDefaultCase >\n";
			for (auto &ptr: mDefault->get_block())
				ptr->dump(o);
			o << "< EndDefaultCase >\n";
		}
		o << "< EndSwitch >\n";
	}